

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcRelDecomposes::~IfcRelDecomposes(IfcRelDecomposes *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this[-1].field_0x48 = 0x9519b0;
  *(undefined8 *)&this->field_0x30 = 0x951a28;
  *(undefined8 *)&this[-1].field_0xd0 = 0x9519d8;
  *(undefined8 *)this = 0x951a00;
  if (*(void **)&this->field_0x18 != (void *)0x0) {
    operator_delete(*(void **)&this->field_0x18);
  }
  *(undefined8 *)&this[-1].field_0x48 = 0x951b40;
  *(undefined8 *)&this->field_0x30 = 0x951b68;
  puVar1 = *(undefined1 **)
            &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDecomposes,_2UL>.field_0x10;
  if (puVar1 != &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDecomposes,_2UL>.
                 field_0x20) {
    operator_delete(puVar1);
  }
  if (*(undefined1 **)&this[-1].field_0x80 != &this[-1].field_0x90) {
    operator_delete(*(undefined1 **)&this[-1].field_0x80);
  }
  if (*(undefined1 **)&this[-1].field_0x58 != &this[-1].field_0x68) {
    operator_delete(*(undefined1 **)&this[-1].field_0x58);
  }
  operator_delete(&this[-1].field_0x48);
  return;
}

Assistant:

IfcRelDecomposes() : Object("IfcRelDecomposes") {}